

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QList<QBenchmarkResult>>::emplace<QList<QBenchmarkResult>const&>
          (QMovableArrayOps<QList<QBenchmarkResult>> *this,qsizetype i,QList<QBenchmarkResult> *args
          )

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  Data *pDVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QBenchmarkResult> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_0013727e:
    local_48.d = (args->d).d;
    local_48.ptr = (args->d).ptr;
    local_48.size = (args->d).size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar3 = *(long *)(this + 0x10);
    QArrayDataPointer<QList<QBenchmarkResult>_>::detachAndGrow
              ((QArrayDataPointer<QList<QBenchmarkResult>_> *)this,(uint)(i == 0 && lVar3 != 0),1,
               (QList<QBenchmarkResult> **)0x0,(QArrayDataPointer<QList<QBenchmarkResult>_> *)0x0);
    lVar4 = *(long *)(this + 8);
    if (i == 0 && lVar3 != 0) {
      *(Data **)(lVar4 + -0x18) = local_48.d;
      *(QBenchmarkResult **)(lVar4 + -0x10) = local_48.ptr;
      *(qsizetype *)(lVar4 + -8) = local_48.size;
      *(long *)(this + 8) = lVar4 + -0x18;
    }
    else {
      plVar1 = (long *)(lVar4 + i * 0x18);
      memmove(plVar1 + 3,(void *)(lVar4 + i * 0x18),(*(long *)(this + 0x10) - i) * 0x18);
      *plVar1 = (long)local_48.d;
      plVar1[1] = (long)local_48.ptr;
      plVar1[2] = local_48.size;
    }
    local_48.size = 0;
    local_48.ptr = (QBenchmarkResult *)0x0;
    local_48.d = (Data *)0x0;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    QArrayDataPointer<QBenchmarkResult>::~QArrayDataPointer(&local_48);
  }
  else {
    lVar3 = *(long *)(this + 0x10);
    if ((lVar3 == i && piVar2 != (int *)0x0) &&
       (*(long *)(piVar2 + 2) - lVar3 !=
        ((long)(*(long *)(this + 8) - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      lVar4 = *(long *)(this + 8);
      pDVar5 = (args->d).d;
      *(Data **)(lVar4 + lVar3 * 0x18) = pDVar5;
      *(QBenchmarkResult **)(lVar4 + 8 + lVar3 * 0x18) = (args->d).ptr;
      *(qsizetype *)(lVar4 + 0x10 + lVar3 * 0x18) = (args->d).size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if (((i != 0) || (piVar2 == (int *)0x0)) ||
         (((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8))) goto LAB_0013727e;
      lVar3 = *(long *)(this + 8);
      pDVar5 = (args->d).d;
      *(Data **)(lVar3 + -0x18) = pDVar5;
      *(QBenchmarkResult **)(lVar3 + -0x10) = (args->d).ptr;
      *(qsizetype *)(lVar3 + -8) = (args->d).size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }